

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O0

void __thiscall icu_63::UnicodeSet::UnicodeSet(UnicodeSet *this,UnicodeSet *o)

{
  UBool UVar1;
  UChar32 *pUVar2;
  int local_44;
  UErrorCode local_28 [2];
  UErrorCode status;
  UnicodeSet *local_18;
  UnicodeSet *o_local;
  UnicodeSet *this_local;
  
  local_18 = o;
  o_local = this;
  UnicodeFilter::UnicodeFilter(&this->super_UnicodeFilter,&o->super_UnicodeFilter);
  (this->super_UnicodeFilter).super_UnicodeFunctor.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeSet_004efe70;
  (this->super_UnicodeFilter).super_UnicodeMatcher._vptr_UnicodeMatcher =
       (_func_int **)&PTR__UnicodeSet_004eff88;
  this->len = 0;
  UVar1 = isFrozen(local_18);
  if (UVar1 == '\0') {
    local_44 = local_18->len + 0x10;
  }
  else {
    local_44 = local_18->len;
  }
  this->capacity = local_44;
  this->list = (UChar32 *)0x0;
  this->bmpSet = (BMPSet *)0x0;
  this->buffer = (UChar32 *)0x0;
  this->bufferCapacity = 0;
  this->patLen = 0;
  this->pat = (char16_t *)0x0;
  this->strings = (UVector *)0x0;
  this->stringSpan = (UnicodeSetStringSpan *)0x0;
  this->fFlags = '\0';
  local_28[0] = U_ZERO_ERROR;
  allocateStrings(this,local_28);
  UVar1 = ::U_FAILURE(local_28[0]);
  if (UVar1 == '\0') {
    pUVar2 = (UChar32 *)uprv_malloc_63((long)this->capacity << 2);
    this->list = pUVar2;
    if (this->list == (UChar32 *)0x0) {
      setToBogus(this);
    }
    else {
      operator=(this,local_18);
    }
  }
  else {
    setToBogus(this);
  }
  return;
}

Assistant:

UnicodeSet::UnicodeSet(const UnicodeSet& o) :
    UnicodeFilter(o),
    len(0), capacity(o.isFrozen() ? o.len : o.len + GROW_EXTRA), list(0),
    bmpSet(0),
    buffer(0), bufferCapacity(0),
    patLen(0), pat(NULL), strings(NULL), stringSpan(NULL),
    fFlags(0)
{
    UErrorCode status = U_ZERO_ERROR;
    allocateStrings(status);
    if (U_FAILURE(status)) {
        setToBogus(); // If memory allocation failed, set to bogus state.
        return;
    }
    list = (UChar32*) uprv_malloc(sizeof(UChar32) * capacity);
    if(list!=NULL){
        *this = o;
    } else { // If memory allocation failed, set to bogus state.
        setToBogus();
        return;
    }
    _dbgct(this);
}